

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_build_session_ticket_auth_data(ptls_buffer_t *auth_data,quicly_context_t *ctx)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  bool bVar6;
  
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 != 0) {
    return iVar3;
  }
  sVar1 = auth_data->off;
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\x0e';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 != 0) goto LAB_0012e541;
    puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                 (ctx->transport_params).active_connection_id_limit);
    sVar5 = (long)puVar4 - (long)auth_data->base;
    auth_data->off = sVar5;
    iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
    bVar6 = iVar3 == 0;
  }
  else {
LAB_0012e541:
    bVar6 = false;
  }
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\x04';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 != 0) goto LAB_0012e5aa;
    puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,(ctx->transport_params).max_data);
    sVar5 = (long)puVar4 - (long)auth_data->base;
    auth_data->off = sVar5;
    iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
    bVar6 = iVar3 == 0;
  }
  else {
LAB_0012e5aa:
    bVar6 = false;
  }
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\x05';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 != 0) goto LAB_0012e613;
    puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                 (ctx->transport_params).max_stream_data.bidi_local);
    sVar5 = (long)puVar4 - (long)auth_data->base;
    auth_data->off = sVar5;
    iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
    bVar6 = iVar3 == 0;
  }
  else {
LAB_0012e613:
    bVar6 = false;
  }
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\x06';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 != 0) goto LAB_0012e67c;
    puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                 (ctx->transport_params).max_stream_data.bidi_remote);
    sVar5 = (long)puVar4 - (long)auth_data->base;
    auth_data->off = sVar5;
    iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
    bVar6 = iVar3 == 0;
  }
  else {
LAB_0012e67c:
    bVar6 = false;
  }
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\a';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 != 0) goto LAB_0012e6e5;
    puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                 (ctx->transport_params).max_stream_data.uni);
    sVar5 = (long)puVar4 - (long)auth_data->base;
    auth_data->off = sVar5;
    iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
    bVar6 = iVar3 == 0;
  }
  else {
LAB_0012e6e5:
    bVar6 = false;
  }
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\b';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 != 0) goto LAB_0012e74e;
    puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                 (ctx->transport_params).max_streams_bidi);
    sVar5 = (long)puVar4 - (long)auth_data->base;
    auth_data->off = sVar5;
    iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
    bVar6 = iVar3 == 0;
  }
  else {
LAB_0012e74e:
    bVar6 = false;
  }
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(auth_data,8);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar4 = auth_data->base;
  sVar2 = auth_data->off;
  puVar4[sVar2] = '\t';
  auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar2 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 == 0) {
      puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                   (ctx->transport_params).max_streams_uni);
      sVar5 = (long)puVar4 - (long)auth_data->base;
      auth_data->off = sVar5;
      iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
      bVar6 = iVar3 == 0;
      goto LAB_0012e7b1;
    }
  }
  bVar6 = false;
LAB_0012e7b1:
  if (!bVar6) {
    return iVar3;
  }
  iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,auth_data->off - sVar1);
  return iVar3;
}

Assistant:

int quicly_build_session_ticket_auth_data(ptls_buffer_t *auth_data, const quicly_context_t *ctx)
{
    int ret;

#define PUSH_TP(id, block)                                                                                                         \
    do {                                                                                                                           \
        ptls_buffer_push_quicint(auth_data, id);                                                                                   \
        ptls_buffer_push_block(auth_data, -1, block);                                                                              \
    } while (0)

    ptls_buffer_push_block(auth_data, -1, {
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.active_connection_id_limit); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_data); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.bidi_local); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.bidi_remote); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.uni); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_streams_bidi); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_streams_uni); });
    });

#undef PUSH_TP

    ret = 0;
Exit:
    return ret;
}